

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  uint uVar1;
  exr_result_t eVar2;
  code *UNRECOVERED_JUMPTABLE;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  exr_attribute_list_t *list;
  ulong uVar8;
  exr_attribute_t *attr;
  exr_attribute_t *local_40;
  ulong local_38;
  
  local_40 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar2 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar2;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 0x15;
  }
  else {
    if (*ctxt != (_priv_exr_context_t)0x0) {
      if (size < 0) {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"Invalid size (%d) for string vector \'%s\'",size,name,
                           *(code **)(ctxt + 0x48));
        return eVar2;
      }
      if (val == (char **)0x0) {
        eVar2 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"No input string values for setting \'%s\', type \'stringvector\'"
                           ,name,*(code **)(ctxt + 0x48));
        return eVar2;
      }
      list = (exr_attribute_list_t *)
             (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
      eVar2 = exr_attr_list_find_by_name(ctxt,list,name,&local_40);
      if (eVar2 == 0) {
        if (local_40->type == EXR_ATTR_STRING_VECTOR) {
          uVar1 = ((local_40->field_6).chlist)->num_channels;
          uVar8 = (ulong)uVar1;
          if ((uVar1 == size) && (0 < ((local_40->field_6).chlist)->num_alloced)) {
            if (*ctxt == (_priv_exr_context_t)0x1) {
              if (size != 0) {
                uVar8 = 0;
                do {
                  eVar2 = exr_attr_string_vector_set_entry
                                    (ctxt,(local_40->field_6).stringvector,(int32_t)uVar8,val[uVar8]
                                    );
                  if (eVar2 != 0) {
                    return eVar2;
                  }
                  uVar8 = uVar8 + 1;
                } while (uVar8 < (uint)size);
                return 0;
              }
            }
            else if (size != 0) {
              local_38 = (ulong)(uint)size;
              lVar5 = 0;
              uVar8 = 0;
              while( true ) {
                pcVar4 = val[uVar8];
                if (pcVar4 == (char *)0x0) {
                  eVar2 = (**(code **)(ctxt + 0x48))
                                    (ctxt,3,"\'%s\' received NULL string in string vector",name);
                  return eVar2;
                }
                sVar3 = strlen(pcVar4);
                sVar7 = (size_t)*(int *)((long)&((local_40->field_6).stringvector)->strings->length
                                        + lVar5);
                if (sVar3 != sVar7) break;
                eVar2 = exr_attr_string_vector_set_entry_with_length
                                  (ctxt,(local_40->field_6).stringvector,(int32_t)uVar8,pcVar4,
                                   (int32_t)sVar3);
                if (eVar2 != 0) {
                  return eVar2;
                }
                uVar8 = uVar8 + 1;
                lVar5 = lVar5 + 0x10;
                if (local_38 <= uVar8) {
                  return 0;
                }
              }
              pcVar4 = 
              "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
              ;
              uVar6 = 3;
              uVar8 = uVar8 & 0xffffffff;
              goto LAB_0011adf4;
            }
          }
          else {
            if (*ctxt != (_priv_exr_context_t)0x1) {
              pcVar4 = 
              "Existing string vector \'%s\' has %d strings, but given %d, unable to change";
              uVar6 = 0x14;
              sVar7 = (size_t)(uint)size;
LAB_0011adf4:
              eVar2 = (**(code **)(ctxt + 0x48))(ctxt,uVar6,pcVar4,name,uVar8,sVar7);
              return eVar2;
            }
            if (size != 0) {
              uVar8 = 0;
              do {
                eVar2 = exr_attr_string_vector_set_entry
                                  (ctxt,(local_40->field_6).stringvector,(int32_t)uVar8,val[uVar8]);
                if (eVar2 != 0) {
                  return eVar2;
                }
                uVar8 = uVar8 + 1;
              } while (uVar8 < (uint)size);
              return 0;
            }
          }
          eVar2 = 0;
        }
        else {
          eVar2 = (**(code **)(ctxt + 0x48))
                            (ctxt,0x10,
                             "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'",
                             name,local_40->type_name);
        }
      }
      else if ((((eVar2 == 0xf) && (eVar2 = 0xf, *ctxt == (_priv_exr_context_t)0x1)) &&
               (eVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_STRING_VECTOR,0,(uint8_t **)0x0,
                                          &local_40), eVar2 == 0)) &&
              (eVar2 = exr_attr_string_vector_init(ctxt,(local_40->field_6).stringvector,size),
              size != 0 && eVar2 == 0)) {
        uVar8 = 0;
        do {
          eVar2 = exr_attr_string_vector_set_entry
                            (ctxt,(local_40->field_6).stringvector,(int32_t)uVar8,val[uVar8]);
          if (eVar2 != 0) {
            return eVar2;
          }
          uVar8 = uVar8 + 1;
          eVar2 = 0;
        } while (uVar8 < (uint)size);
      }
      return eVar2;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar6 = 8;
  }
  eVar2 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar6);
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (pctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (pctxt->mode != EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_AND_RETURN_PCTXT (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (pctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                            pctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                            pctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (pctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
                pctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}